

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
::resize_buffer(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
                *this,size_type size)

{
  char *from_buffer;
  iffl *this_00;
  long lVar1;
  size_t sVar2;
  buffer_type *pbVar3;
  size_t sVar4;
  pointer_type pcVar5;
  buffer_char_pointer pcVar6;
  size_with_padding_t sVar7;
  default_validate_element_fn<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  *in_R8;
  size_type new_used_capacity;
  size_with_padding_t last_valid_element_size;
  size_type new_last_element_offset;
  undefined1 local_f8 [16];
  tuple<bool&,iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>&>
  local_e8 [23];
  char local_d1;
  pair<bool,_iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>_>
  local_d0;
  undefined1 local_b0 [8];
  flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  buffer_view;
  char *local_90;
  char *last_valid;
  size_with_padding<8UL> sStack_80;
  bool is_valid;
  undefined1 local_68 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
  deallocate_buffer;
  size_t new_buffer_size;
  char *new_buffer;
  sizes_t prev_sizes;
  size_type size_local;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
  *this_local;
  
  prev_sizes.last_element.super_range.buffer_end = size;
  validate_pointer_invariants(this);
  get_all_sizes((sizes_t *)&new_buffer,this);
  new_buffer_size = 0;
  deallocate_buffer.armed_ = false;
  deallocate_buffer._25_7_ = 0;
  make_scoped_deallocator
            ((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
              *)local_68,this,(char **)&new_buffer_size,(size_t *)&deallocate_buffer.armed_);
  if (new_buffer < prev_sizes.last_element.super_range.buffer_end) {
    new_buffer_size = (size_t)allocate_buffer(this,prev_sizes.last_element.super_range.buffer_end);
    deallocate_buffer._24_8_ = prev_sizes.last_element.super_range.buffer_end;
    pbVar3 = buff(this);
    sVar2 = new_buffer_size;
    if (pbVar3->last != (pointer_type)0x0) {
      pbVar3 = buff(this);
      from_buffer = pbVar3->begin;
      sStack_80 = flat_forward_list_sizes<8UL>::used_capacity
                            ((flat_forward_list_sizes<8UL> *)&new_buffer);
      copy_data((char *)sVar2,from_buffer,sStack_80.size);
      sVar2 = new_buffer_size;
      sVar4 = range::begin((range *)&prev_sizes);
      pbVar3 = buff(this);
      pbVar3->last = (pointer_type)(sVar2 + sVar4);
    }
    commit_new_buffer(this,(char **)&new_buffer_size,(size_t *)&deallocate_buffer.armed_);
    pbVar3 = buff(this);
    pcVar5 = pbVar3->begin + prev_sizes.last_element.super_range.buffer_end;
    pbVar3 = buff(this);
    pbVar3->end = pcVar5;
  }
  else if (prev_sizes.last_element.super_range.buffer_end == 0) {
    clear(this);
  }
  else if (prev_sizes.last_element.super_range.buffer_end < new_buffer) {
    new_buffer_size = (size_t)allocate_buffer(this,prev_sizes.last_element.super_range.buffer_end);
    deallocate_buffer._24_8_ = prev_sizes.last_element.super_range.buffer_end;
    last_valid._7_1_ = 1;
    pbVar3 = buff(this);
    local_90 = pbVar3->last;
    buffer_view.buffer_.end =
         (pointer_type)
         flat_forward_list_sizes<8UL>::used_capacity((flat_forward_list_sizes<8UL> *)&new_buffer);
    if (prev_sizes.last_element.super_range.buffer_end < buffer_view.buffer_.end) {
      flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::flat_forward_list_ref
                ((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                  *)local_b0);
      pbVar3 = buff(this);
      this_00 = (iffl *)pbVar3->begin;
      pbVar3 = buff(this);
      flat_forward_list_validate<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,iffl::default_validate_element_fn<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>>
                (&local_d0,this_00,pbVar3->begin + prev_sizes.last_element.super_range.buffer_end,
                 &local_d1,in_R8);
      std::
      tie<bool,iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>>
                ((bool *)local_e8,
                 (flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                  *)((long)&last_valid + 7));
      std::
      tuple<bool&,iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>&>
      ::operator=(local_e8,&local_d0);
      std::
      pair<bool,_iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>_>
      ::~pair(&local_d0);
      if ((last_valid._7_1_ & 1) == 0) {
        flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
        ::last((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                *)local_f8);
        pcVar6 = flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                 ::get_ptr((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                            *)local_f8);
        pbVar3 = buff(this);
        if (pcVar6 == pbVar3->last) {
          std::terminate();
        }
      }
      else {
        flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
        ::last((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                *)(local_f8 + 8));
        pcVar6 = flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                 ::get_ptr((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                            *)(local_f8 + 8));
        pbVar3 = buff(this);
        if (pcVar6 != pbVar3->last) {
          std::terminate();
        }
      }
      flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::last((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)&new_last_element_offset);
      local_90 = flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                 ::get_ptr((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                            *)&new_last_element_offset);
      flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::~flat_forward_list_ref
                ((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                  *)local_b0);
    }
    if (local_90 == (char *)0x0) {
      pbVar3 = buff(this);
      pbVar3->last = (pointer_type)0x0;
    }
    else {
      pbVar3 = buff(this);
      pcVar5 = pbVar3->begin;
      sVar7 = flat_forward_list_traits_traits<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              ::get_size(local_90);
      set_no_next_element(local_90);
      sVar2 = new_buffer_size;
      pbVar3 = buff(this);
      copy_data((char *)sVar2,pbVar3->begin,(size_t)(local_90 + (sVar7.size - (long)pcVar5)));
      lVar1 = new_buffer_size - (long)pcVar5;
      pbVar3 = buff(this);
      pbVar3->last = local_90 + lVar1;
    }
    commit_new_buffer(this,(char **)&new_buffer_size,(size_t *)&deallocate_buffer.armed_);
    pbVar3 = buff(this);
    pcVar5 = pbVar3->begin + prev_sizes.last_element.super_range.buffer_end;
    pbVar3 = buff(this);
    pbVar3->end = pcVar5;
  }
  validate_pointer_invariants(this);
  validate_data_invariants(this);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/vladp72[P]iffl/include/iffl_list.h:5640:33)>
  ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
                  *)local_68);
  return;
}

Assistant:

void resize_buffer(size_type size) {
        validate_pointer_invariants();

        sizes_t const prev_sizes{ get_all_sizes() };

        char *new_buffer{ nullptr };
        size_t new_buffer_size{ 0 };
        auto deallocate_buffer{ make_scoped_deallocator(&new_buffer, &new_buffer_size) };
        //
        // growing capacity
        //
        if (prev_sizes.total_capacity < size) {
            new_buffer = allocate_buffer(size);
            new_buffer_size = size;
            if (nullptr != buff().last) {
                copy_data(new_buffer, buff().begin, prev_sizes.used_capacity().size);
                buff().last = new_buffer + prev_sizes.last_element.begin();
            }
            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        //
        // shrinking to 0 is simple
        //
        } else if (0 == size) {
            clear();
        //
        // to shrink to a smaller size we first need to 
        // find last element that would completely fit 
        // in the new buffer, and if we found any, then
        // make it new last element. If we did not find 
        // any, then designate that there are no last 
        // element
        //
        } else if (prev_sizes.total_capacity > size) {

            new_buffer = allocate_buffer(size);
            new_buffer_size = size;

            bool is_valid{ true };
            char *last_valid{ buff().last };
            //
            // If we are shrinking below used capacity then last element will
            // be removed, and we need to do linear search for the new last element 
            // that would fit new buffer size.
            //
            if (prev_sizes.used_capacity().size > size) {
                flat_forward_list_ref<T, TT> buffer_view;
                std::tie(is_valid, buffer_view) = flat_forward_list_validate<T, TT>(buff().begin,
                                                                                    buff().begin + size);
                if (is_valid) {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() == buff().last);
                } else {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() != buff().last);
                }
                last_valid = buffer_view.last().get_ptr();
            }

            if (last_valid) {
                size_type new_last_element_offset = last_valid - buff().begin;

                size_with_padding_t const last_valid_element_size{ traits_traits::get_size(last_valid) };
                size_type const new_used_capacity{ new_last_element_offset + last_valid_element_size.size };
                
                set_no_next_element(last_valid);
                
                copy_data(new_buffer, buff().begin, new_used_capacity);
                buff().last = new_buffer + new_last_element_offset;
            } else {
                buff().last = nullptr;
            }

            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        }

        validate_pointer_invariants();
        validate_data_invariants();
    }